

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O3

int av1_cdef_compute_sb_list
              (CommonModeInfoParams *mi_params,int mi_row,int mi_col,cdef_list *dlist,BLOCK_SIZE bs)

{
  int iVar1;
  MB_MODE_INFO **ppMVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  MB_MODE_INFO **ppMVar9;
  bool bVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar3 = mi_params->mi_cols - mi_col;
  if ((bs & ~BLOCK_4X8) == BLOCK_128X64) {
    bVar12 = SBORROW4(iVar3,0x20);
    iVar1 = -0x20;
    iVar6 = 0x20;
  }
  else {
    bVar12 = SBORROW4(iVar3,0x10);
    iVar1 = -0x10;
    iVar6 = 0x10;
  }
  if (bVar12 != iVar3 + iVar1 < 0) {
    iVar6 = iVar3;
  }
  iVar3 = mi_params->mi_rows - mi_row;
  if ((bs & ~BLOCK_8X4) == BLOCK_64X128) {
    bVar12 = SBORROW4(iVar3,0x20);
    iVar1 = -0x20;
    iVar5 = 0x20;
  }
  else {
    bVar12 = SBORROW4(iVar3,0x10);
    iVar1 = -0x10;
    iVar5 = 0x10;
  }
  if (bVar12 != iVar3 + iVar1 < 0) {
    iVar5 = iVar3;
  }
  if (iVar5 < 1) {
    iVar3 = 0;
  }
  else {
    ppMVar2 = mi_params->mi_grid_base;
    uVar8 = 0;
    iVar3 = 0;
    do {
      if (0 < iVar6) {
        iVar1 = mi_params->mi_stride;
        uVar11 = 0;
        do {
          ppMVar9 = ppMVar2 + (long)mi_col + (long)(int)(mi_row + uVar8) * (long)iVar1 + uVar11;
          bVar12 = true;
          do {
            bVar10 = bVar12;
            lVar4 = 0;
            bVar12 = true;
            do {
              bVar7 = bVar12;
              if (ppMVar9[lVar4]->skip_txfm == '\0') {
                dlist[iVar3].by = (uint8_t)(uVar8 >> 1);
                dlist[iVar3].bx = (uint8_t)(uVar11 >> 1);
                iVar3 = iVar3 + 1;
                goto LAB_0026f5b3;
              }
              lVar4 = 1;
              bVar12 = false;
            } while (bVar7);
            ppMVar9 = ppMVar9 + iVar1;
            bVar12 = false;
          } while (bVar10);
LAB_0026f5b3:
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < (long)iVar6);
      }
      uVar8 = uVar8 + 2;
    } while ((int)uVar8 < iVar5);
  }
  return iVar3;
}

Assistant:

int av1_cdef_compute_sb_list(const CommonModeInfoParams *const mi_params,
                             int mi_row, int mi_col, cdef_list *dlist,
                             BLOCK_SIZE bs) {
  MB_MODE_INFO **grid = mi_params->mi_grid_base;
  int maxc = mi_params->mi_cols - mi_col;
  int maxr = mi_params->mi_rows - mi_row;

  if (bs == BLOCK_128X128 || bs == BLOCK_128X64)
    maxc = AOMMIN(maxc, MI_SIZE_128X128);
  else
    maxc = AOMMIN(maxc, MI_SIZE_64X64);
  if (bs == BLOCK_128X128 || bs == BLOCK_64X128)
    maxr = AOMMIN(maxr, MI_SIZE_128X128);
  else
    maxr = AOMMIN(maxr, MI_SIZE_64X64);

  const int r_step = 2;  // mi_size_high[BLOCK_8X8]
  const int c_step = 2;  // mi_size_wide[BLOCK_8X8]
  const int r_shift = 1;
  const int c_shift = 1;
  int count = 0;
  for (int r = 0; r < maxr; r += r_step) {
    for (int c = 0; c < maxc; c += c_step) {
      if (!is_8x8_block_skip(grid, mi_row + r, mi_col + c,
                             mi_params->mi_stride)) {
        dlist[count].by = r >> r_shift;
        dlist[count].bx = c >> c_shift;
        count++;
      }
    }
  }
  return count;
}